

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

duckdb_state duckdb_query_arrow_schema(duckdb_arrow result,duckdb_arrow_schema *out_schema)

{
  ArrowSchema *out_schema_00;
  pointer pMVar1;
  pointer pMVar2;
  pointer pMVar3;
  
  if (out_schema != (duckdb_arrow_schema *)0x0) {
    out_schema_00 = (ArrowSchema *)*out_schema;
    pMVar1 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)result);
    pMVar2 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)result);
    pMVar3 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)result);
    duckdb::ArrowConverter::ToArrowSchema
              (out_schema_00,&(pMVar1->super_QueryResult).super_BaseQueryResult.types,
               &(pMVar2->super_QueryResult).super_BaseQueryResult.names,
               &(pMVar3->super_QueryResult).client_properties);
  }
  return DuckDBSuccess;
}

Assistant:

duckdb_state duckdb_query_arrow_schema(duckdb_arrow result, duckdb_arrow_schema *out_schema) {
	if (!out_schema) {
		return DuckDBSuccess;
	}
	auto wrapper = reinterpret_cast<ArrowResultWrapper *>(result);
	try {
		ArrowConverter::ToArrowSchema((ArrowSchema *)*out_schema, wrapper->result->types, wrapper->result->names,
		                              wrapper->result->client_properties);
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}